

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O1

int xmllintShellSetContent(xmllintShellCtxtPtr ctxt,char *value,xmlNodePtr node,xmlNodePtr node2)

{
  int iVar1;
  size_t sVar2;
  xmlNodePtr results;
  undefined8 local_20;
  
  if ((node != (xmlNodePtr)0x0) && (value != (char *)0x0)) {
    sVar2 = strlen(value);
    iVar1 = xmlParseInNodeContext(node,value,sVar2 & 0xffffffff,0,&local_20);
    if (iVar1 == 0) {
      if (node->children != (_xmlNode *)0x0) {
        xmlFreeNodeList();
        node->children = (_xmlNode *)0x0;
        node->last = (_xmlNode *)0x0;
      }
      iVar1 = xmlAddChildList(node,local_20);
    }
    else {
      sVar2 = fwrite("failed to parse content\n",0x18,1,(FILE *)ctxt->output);
      iVar1 = (int)sVar2;
    }
    return iVar1;
  }
  sVar2 = fwrite("NULL\n",5,1,(FILE *)ctxt->output);
  return (int)sVar2;
}

Assistant:

static int
xmllintShellSetContent(xmllintShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *value, xmlNodePtr node,
            xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr results;
    xmlParserErrors ret;

    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if (value == NULL) {
        fprintf(ctxt->output, "NULL\n");
	return (0);
    }

    ret = xmlParseInNodeContext(node, value, strlen(value), 0, &results);
    if (ret == XML_ERR_OK) {
	if (node->children != NULL) {
	    xmlFreeNodeList(node->children);
	    node->children = NULL;
	    node->last = NULL;
	}
	xmlAddChildList(node, results);
    } else {
        fprintf(ctxt->output, "failed to parse content\n");
    }
    return (0);
}